

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadObjsen(MPSInput *mps)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  MPSInput *in_RDI;
  MPSInput *in_stack_00000098;
  
  bVar1 = MPSInput::readLine(in_stack_00000098);
  if ((bVar1) && (pcVar3 = MPSInput::field1(in_RDI), pcVar3 != (char *)0x0)) {
    pcVar3 = MPSInput::field1(in_RDI);
    iVar2 = strcmp(pcVar3,"MIN");
    if (iVar2 == 0) {
      MPSInput::setObjSense(in_RDI,MINIMIZE);
    }
    else {
      pcVar3 = MPSInput::field1(in_RDI);
      iVar2 = strcmp(pcVar3,"MAX");
      if (iVar2 != 0) goto LAB_0012dbf9;
      MPSInput::setObjSense(in_RDI,MAXIMIZE);
    }
    bVar1 = MPSInput::readLine(in_stack_00000098);
    if ((bVar1) && (pcVar3 = MPSInput::field0(in_RDI), pcVar3 != (char *)0x0)) {
      pcVar3 = MPSInput::field0(in_RDI);
      iVar2 = strcmp(pcVar3,"ROWS");
      if (iVar2 == 0) {
        MPSInput::setSection(in_RDI,ROWS);
        return;
      }
      pcVar3 = MPSInput::field0(in_RDI);
      iVar2 = strcmp(pcVar3,"OBJNAME");
      if (iVar2 == 0) {
        MPSInput::setSection(in_RDI,OBJNAME);
        return;
      }
    }
  }
LAB_0012dbf9:
  MPSInput::syntaxError(mps);
  return;
}

Assistant:

static inline void MPSreadObjsen(MPSInput& mps)
{
   do
   {
      // This has to be the Line with MIN or MAX.
      if(!mps.readLine() || (mps.field1() == nullptr))
         break;

      if(!strcmp(mps.field1(), "MIN"))
         mps.setObjSense(MPSInput::MINIMIZE);
      else if(!strcmp(mps.field1(), "MAX"))
         mps.setObjSense(MPSInput::MAXIMIZE);
      else
         break;

      // Look for ROWS or OBJNAME Section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}